

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strlen(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int local_24;
  jx9_value **ppjStack_20;
  int iLen;
  jx9_value **apArg_local;
  jx9_context *pjStack_10;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_24 = 0;
  ppjStack_20 = apArg;
  apArg_local._4_4_ = nArg;
  pjStack_10 = pCtx;
  if (0 < nArg) {
    jx9_value_to_string(*apArg,&local_24);
  }
  jx9_result_int(pjStack_10,local_24);
  return 0;
}

Assistant:

static int jx9Builtin_strlen(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen = 0;
	if( nArg > 0 ){
		jx9_value_to_string(apArg[0], &iLen);
	}
	/* String length */
	jx9_result_int(pCtx, iLen);
	return JX9_OK;
}